

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

void websocket_on_unwrapped
               (void *ws_p,void *msg,uint64_t len,char first,char last,char text,uchar rsv)

{
  code *pcVar1;
  ulong uVar2;
  char cVar3;
  FIOBJ FVar4;
  fiobj_object_vtable_s *pfVar5;
  uint uVar6;
  uint uVar7;
  fio_str_info_s ret;
  fio_str_info_s local_58;
  undefined8 local_38;
  uint64_t uStack_30;
  void *local_28;
  
  if (first != '\0' && last != '\0') {
    local_38 = 0;
    uStack_30 = len;
    local_28 = msg;
    (**(code **)((long)ws_p + 0x38))(ws_p,text);
    return;
  }
  if (first != '\0') {
    *(char *)((long)ws_p + 0xb0) = text;
    if (*(long *)((long)ws_p + 0xa8) == 0) {
      FVar4 = fiobj_str_buf(len);
      *(FIOBJ *)((long)ws_p + 0xa8) = FVar4;
    }
    fiobj_str_resize(*(FIOBJ *)((long)ws_p + 0xa8),0);
  }
  fiobj_str_write(*(FIOBJ *)((long)ws_p + 0xa8),(char *)msg,len);
  if (last == '\0') {
    return;
  }
  pcVar1 = *(code **)((long)ws_p + 0x38);
  uVar2 = *(ulong *)((long)ws_p + 0xa8);
  if (uVar2 == 0) {
LAB_0015d440:
    local_58.data = anon_var_dwarf_20f;
    local_58.len._0_4_ = 4;
    goto LAB_0015d453;
  }
  if ((uVar2 & 1) != 0) {
    fio_ltocstr(&local_58,(long)uVar2 >> 1);
    goto LAB_0015d4f0;
  }
  uVar6 = (uint)uVar2 & 6;
  cVar3 = '(';
  switch(uVar6) {
  case 0:
switchD_0015d40d_caseD_0:
    cVar3 = *(char *)(uVar2 & 0xfffffffffffffff8);
    break;
  case 4:
switchD_0015d40d_caseD_4:
    cVar3 = '*';
    break;
  case 6:
    if ((char)uVar2 == '&') {
      local_58.data = anon_var_dwarf_21a;
      local_58.len._0_4_ = 5;
    }
    else {
      uVar7 = (uint)uVar2 & 0xff;
      if (uVar7 != 0x16) {
        if (uVar7 == 6) goto LAB_0015d440;
        switch(uVar6) {
        case 0:
          goto switchD_0015d40d_caseD_0;
        case 4:
          goto switchD_0015d40d_caseD_4;
        case 6:
          cVar3 = (char)uVar2;
        }
        break;
      }
      local_58.data = anon_var_dwarf_225;
      local_58.len._0_4_ = 4;
    }
LAB_0015d453:
    local_58.capa._0_4_ = 0;
    local_58.capa._4_4_ = 0;
    local_58.len._4_4_ = 0;
    goto LAB_0015d4f0;
  }
  switch(cVar3) {
  case '\'':
    pfVar5 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar5 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar5 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar5 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar5 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar5 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar5->to_str)(&local_58,uVar2);
LAB_0015d4f0:
  (*pcVar1)(ws_p,*(undefined1 *)((long)ws_p + 0xb0));
  return;
}

Assistant:

static void websocket_on_unwrapped(void *ws_p, void *msg, uint64_t len,
                                   char first, char last, char text,
                                   unsigned char rsv) {
  ws_s *ws = ws_p;
  if (last && first) {
    ws->on_message(ws, (fio_str_info_s){.data = msg, .len = len},
                   (uint8_t)text);
    return;
  }
  if (first) {
    ws->is_text = (uint8_t)text;
    if (ws->msg == FIOBJ_INVALID)
      ws->msg = fiobj_str_buf(len);
    fiobj_str_resize(ws->msg, 0);
  }
  fiobj_str_write(ws->msg, msg, len);
  if (last) {
    ws->on_message(ws, fiobj_obj2cstr(ws->msg), ws->is_text);
  }

  (void)rsv;
}